

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::NavScoreItem(ImGuiNavItemData *result)

{
  ImVec2 IVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  uint uVar6;
  ImRect *pIVar7;
  float *pfVar8;
  float *pfVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float local_10;
  float fStack_c;
  float local_8;
  float fStack_4;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if (GImGui->NavLayer != (pIVar3->DC).NavLayerCurrent) {
    return false;
  }
  local_8 = (GImGui->LastItemData).NavRect.Min.x;
  fStack_4 = (GImGui->LastItemData).NavRect.Min.y;
  local_10 = (GImGui->LastItemData).NavRect.Max.x;
  fStack_c = (GImGui->LastItemData).NavRect.Max.y;
  fVar12 = (GImGui->NavScoringRect).Min.x;
  fVar13 = (GImGui->NavScoringRect).Min.y;
  fVar11 = (GImGui->NavScoringRect).Max.x;
  fVar14 = (GImGui->NavScoringRect).Max.y;
  GImGui->NavScoringDebugCount = GImGui->NavScoringDebugCount + 1;
  if (pIVar3->ParentWindow == pIVar4->NavWindow) {
    if ((pIVar3->ClipRect).Max.y <= fStack_4) {
      return false;
    }
    fVar15 = (pIVar3->ClipRect).Min.y;
    if (fStack_c <= fVar15) {
      return false;
    }
    if ((pIVar3->ClipRect).Max.x <= local_8) {
      return false;
    }
    fVar16 = (pIVar3->ClipRect).Min.x;
    if (local_10 <= fVar16) {
      return false;
    }
    IVar1 = (pIVar3->ClipRect).Max;
    fVar17 = IVar1.x;
    fVar18 = IVar1.y;
    fVar19 = fVar15;
    if ((fVar15 <= fStack_4) && (fVar19 = fVar18, fStack_4 <= fVar18)) {
      fVar19 = fStack_4;
    }
    fStack_4 = fVar19;
    fVar19 = fVar17;
    if (local_8 <= fVar17) {
      fVar19 = local_8;
    }
    local_8 = (float)(-(uint)(local_8 < fVar16) & (uint)fVar16 |
                     ~-(uint)(local_8 < fVar16) & (uint)fVar19);
    if ((fVar15 <= fStack_c) && (fVar15 = fVar18, fStack_c <= fVar18)) {
      fVar15 = fStack_c;
    }
    if (local_10 <= fVar17) {
      fVar17 = local_10;
    }
    local_10 = (float)(-(uint)(local_10 < fVar16) & (uint)fVar16 |
                      ~-(uint)(local_10 < fVar16) & (uint)fVar17);
    fStack_c = fVar15;
  }
  if ((uint)pIVar4->NavMoveClipDir < 2) {
    pfVar8 = &fStack_c;
    pfVar9 = &fStack_4;
    lVar10 = 0xc;
    pIVar7 = (ImRect *)&(pIVar3->ClipRect).Min.y;
    fVar15 = fStack_c;
    fVar16 = fStack_4;
  }
  else {
    pfVar9 = &local_8;
    lVar10 = 8;
    pfVar8 = &local_10;
    pIVar7 = &pIVar3->ClipRect;
    fVar15 = local_10;
    fVar16 = local_8;
  }
  fVar17 = (pIVar7->Min).x;
  fVar19 = *(float *)((long)&(pIVar3->ClipRect).Min.x + lVar10);
  fVar18 = fVar19;
  if (fVar16 <= fVar19) {
    fVar18 = fVar16;
  }
  *pfVar9 = (float)(-(uint)(fVar16 < fVar17) & (uint)fVar17 |
                   ~-(uint)(fVar16 < fVar17) & (uint)fVar18);
  if (fVar15 <= fVar19) {
    fVar19 = fVar15;
  }
  *pfVar8 = (float)(-(uint)(fVar15 < fVar17) & (uint)fVar17 |
                   ~-(uint)(fVar15 < fVar17) & (uint)fVar19);
  if (fVar12 <= local_10) {
    fVar15 = 0.0;
    if (fVar11 < local_8) {
      fVar15 = local_8 - fVar11;
    }
  }
  else {
    fVar15 = local_10 - fVar12;
  }
  fVar19 = fVar14 - fVar13;
  fVar16 = (fStack_c - fStack_4) * 0.8 + fStack_4;
  fVar17 = fVar19 * 0.2 + fVar13;
  if (fVar17 <= fVar16) {
    fVar16 = (fStack_c - fStack_4) * 0.2 + fStack_4;
    fVar17 = fVar19 * 0.8 + fVar13;
    if (fVar17 < fVar16) {
      fVar16 = fVar16 - fVar17;
      goto LAB_001fd0b8;
    }
    fVar16 = 0.0;
    bVar5 = false;
  }
  else {
    fVar16 = fVar16 - fVar17;
LAB_001fd0b8:
    bVar5 = fVar16 != 0.0;
    if (((fVar15 != 0.0) || (NAN(fVar15))) && ((fVar16 != 0.0 || (NAN(fVar16))))) {
      fVar15 = fVar15 / 1000.0 + *(float *)(&DAT_0025acd8 + (ulong)(0.0 < fVar15) * 4);
      bVar5 = true;
    }
  }
  fVar11 = (local_8 + local_10) - (fVar12 + fVar11);
  fVar12 = (fStack_4 + fStack_c) - (fVar13 + fVar14);
  fVar13 = ABS(fVar16) + ABS(fVar15);
  fVar14 = ABS(fVar11) + ABS(fVar12);
  if (bVar5) {
LAB_001fd172:
    fVar17 = fVar13;
    uVar6 = (uint)(0.0 < fVar15);
    fVar12 = fVar16;
    fVar11 = fVar15;
    if (ABS(fVar15) <= ABS(fVar16)) {
      uVar6 = 0.0 < fVar16 | 2;
    }
  }
  else {
    if ((fVar15 != 0.0) || (NAN(fVar15))) goto LAB_001fd172;
    if ((((fVar11 != 0.0) || (NAN(fVar11))) || (fVar12 != 0.0)) || (NAN(fVar12))) {
      fVar17 = fVar14;
      uVar6 = 0.0 < fVar12 | 2;
      if (ABS(fVar12) < ABS(fVar11)) {
        uVar6 = (uint)(0.0 < fVar11);
      }
    }
    else {
      fVar17 = 0.0;
      uVar6 = (uint)(pIVar4->NavId <= (pIVar4->LastItemData).ID);
      fVar12 = 0.0;
      fVar11 = 0.0;
    }
  }
  uVar2 = pIVar4->NavMoveDir;
  fVar19 = result->DistBox;
  if (uVar6 == uVar2) {
    if (fVar13 < fVar19) {
      result->DistBox = fVar13;
      result->DistCenter = fVar14;
      return true;
    }
    if ((fVar13 == fVar19) && (!NAN(fVar13) && !NAN(fVar19))) {
      fVar13 = result->DistCenter;
      if (fVar14 < fVar13) {
        result->DistCenter = fVar14;
LAB_001fd210:
        bVar5 = true;
        goto LAB_001fd216;
      }
      if ((fVar14 == fVar13) && (!NAN(fVar14) && !NAN(fVar13))) {
        if ((uVar6 & 2) == 0) {
          fVar16 = fVar15;
        }
        if (fVar16 < 0.0) goto LAB_001fd210;
      }
    }
  }
  bVar5 = false;
LAB_001fd216:
  if (((((fVar19 == 3.4028235e+38) && (!NAN(fVar19))) && (fVar17 < result->DistAxial)) &&
      ((pIVar4->NavLayer == ImGuiNavLayer_Menu && ((pIVar4->NavWindow->Flags & 0x10000000) == 0))))
     && ((((uVar2 == 0 && (fVar11 < 0.0)) ||
          (((uVar2 == 1 && (0.0 < fVar11)) || ((uVar2 == 2 && (fVar12 < 0.0)))))) ||
         ((uVar2 == 3 && (0.0 < fVar12)))))) {
    result->DistAxial = fVar17;
    return true;
  }
  return bVar5;
}

Assistant:

static bool ImGui::NavScoreItem(ImGuiNavItemData* result)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavLayer != window->DC.NavLayerCurrent)
        return false;

    // FIXME: Those are not good variables names
    ImRect cand = g.LastItemData.NavRect;   // Current item nav rectangle
    const ImRect curr = g.NavScoringRect;   // Current modified source rect (NB: we've applied Max.x = Min.x in NavUpdate() to inhibit the effect of having varied item width)
    g.NavScoringDebugCount++;

    // When entering through a NavFlattened border, we consider child window items as fully clipped for scoring
    if (window->ParentWindow == g.NavWindow)
    {
        IM_ASSERT((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened);
        if (!window->ClipRect.Overlaps(cand))
            return false;
        cand.ClipWithFull(window->ClipRect); // This allows the scored item to not overlap other candidates in the parent window
    }

    // We perform scoring on items bounding box clipped by the current clipping rectangle on the other axis (clipping on our movement axis would give us equal scores for all clipped items)
    // For example, this ensures that items in one column are not reached when moving vertically from items in another column.
    NavClampRectToVisibleAreaForMoveDir(g.NavMoveClipDir, cand, window->ClipRect);

    // Compute distance between boxes
    // FIXME-NAV: Introducing biases for vertical navigation, needs to be removed.
    float dbx = NavScoreItemDistInterval(cand.Min.x, cand.Max.x, curr.Min.x, curr.Max.x);
    float dby = NavScoreItemDistInterval(ImLerp(cand.Min.y, cand.Max.y, 0.2f), ImLerp(cand.Min.y, cand.Max.y, 0.8f), ImLerp(curr.Min.y, curr.Max.y, 0.2f), ImLerp(curr.Min.y, curr.Max.y, 0.8f)); // Scale down on Y to keep using box-distance for vertically touching items
    if (dby != 0.0f && dbx != 0.0f)
        dbx = (dbx / 1000.0f) + ((dbx > 0.0f) ? +1.0f : -1.0f);
    float dist_box = ImFabs(dbx) + ImFabs(dby);

    // Compute distance between centers (this is off by a factor of 2, but we only compare center distances with each other so it doesn't matter)
    float dcx = (cand.Min.x + cand.Max.x) - (curr.Min.x + curr.Max.x);
    float dcy = (cand.Min.y + cand.Max.y) - (curr.Min.y + curr.Max.y);
    float dist_center = ImFabs(dcx) + ImFabs(dcy); // L1 metric (need this for our connectedness guarantee)

    // Determine which quadrant of 'curr' our candidate item 'cand' lies in based on distance
    ImGuiDir quadrant;
    float dax = 0.0f, day = 0.0f, dist_axial = 0.0f;
    if (dbx != 0.0f || dby != 0.0f)
    {
        // For non-overlapping boxes, use distance between boxes
        dax = dbx;
        day = dby;
        dist_axial = dist_box;
        quadrant = ImGetDirQuadrantFromDelta(dbx, dby);
    }
    else if (dcx != 0.0f || dcy != 0.0f)
    {
        // For overlapping boxes with different centers, use distance between centers
        dax = dcx;
        day = dcy;
        dist_axial = dist_center;
        quadrant = ImGetDirQuadrantFromDelta(dcx, dcy);
    }
    else
    {
        // Degenerate case: two overlapping buttons with same center, break ties arbitrarily (note that LastItemId here is really the _previous_ item order, but it doesn't matter)
        quadrant = (g.LastItemData.ID < g.NavId) ? ImGuiDir_Left : ImGuiDir_Right;
    }

#if IMGUI_DEBUG_NAV_SCORING
    char buf[128];
    if (IsMouseHoveringRect(cand.Min, cand.Max))
    {
        ImFormatString(buf, IM_ARRAYSIZE(buf), "dbox (%.2f,%.2f->%.4f)\ndcen (%.2f,%.2f->%.4f)\nd (%.2f,%.2f->%.4f)\nnav %c, quadrant %c", dbx, dby, dist_box, dcx, dcy, dist_center, dax, day, dist_axial, "WENS"[g.NavMoveDir], "WENS"[quadrant]);
        ImDrawList* draw_list = GetForegroundDrawList(window);
        draw_list->AddRect(curr.Min, curr.Max, IM_COL32(255,200,0,100));
        draw_list->AddRect(cand.Min, cand.Max, IM_COL32(255,255,0,200));
        draw_list->AddRectFilled(cand.Max - ImVec2(4, 4), cand.Max + CalcTextSize(buf) + ImVec2(4, 4), IM_COL32(40,0,0,150));
        draw_list->AddText(cand.Max, ~0U, buf);
    }
    else if (g.IO.KeyCtrl) // Hold to preview score in matching quadrant. Press C to rotate.
    {
        if (quadrant == g.NavMoveDir)
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%.0f/%.0f", dist_box, dist_center);
            ImDrawList* draw_list = GetForegroundDrawList(window);
            draw_list->AddRectFilled(cand.Min, cand.Max, IM_COL32(255, 0, 0, 200));
            draw_list->AddText(cand.Min, IM_COL32(255, 255, 255, 255), buf);
        }
    }
#endif

    // Is it in the quadrant we're interested in moving to?
    bool new_best = false;
    const ImGuiDir move_dir = g.NavMoveDir;
    if (quadrant == move_dir)
    {
        // Does it beat the current best candidate?
        if (dist_box < result->DistBox)
        {
            result->DistBox = dist_box;
            result->DistCenter = dist_center;
            return true;
        }
        if (dist_box == result->DistBox)
        {
            // Try using distance between center points to break ties
            if (dist_center < result->DistCenter)
            {
                result->DistCenter = dist_center;
                new_best = true;
            }
            else if (dist_center == result->DistCenter)
            {
                // Still tied! we need to be extra-careful to make sure everything gets linked properly. We consistently break ties by symbolically moving "later" items
                // (with higher index) to the right/downwards by an infinitesimal amount since we the current "best" button already (so it must have a lower index),
                // this is fairly easy. This rule ensures that all buttons with dx==dy==0 will end up being linked in order of appearance along the x axis.
                if (((move_dir == ImGuiDir_Up || move_dir == ImGuiDir_Down) ? dby : dbx) < 0.0f) // moving bj to the right/down decreases distance
                    new_best = true;
            }
        }
    }

    // Axial check: if 'curr' has no link at all in some direction and 'cand' lies roughly in that direction, add a tentative link. This will only be kept if no "real" matches
    // are found, so it only augments the graph produced by the above method using extra links. (important, since it doesn't guarantee strong connectedness)
    // This is just to avoid buttons having no links in a particular direction when there's a suitable neighbor. you get good graphs without this too.
    // 2017/09/29: FIXME: This now currently only enabled inside menu bars, ideally we'd disable it everywhere. Menus in particular need to catch failure. For general navigation it feels awkward.
    // Disabling it may lead to disconnected graphs when nodes are very spaced out on different axis. Perhaps consider offering this as an option?
    if (result->DistBox == FLT_MAX && dist_axial < result->DistAxial)  // Check axial match
        if (g.NavLayer == ImGuiNavLayer_Menu && !(g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
            if ((move_dir == ImGuiDir_Left && dax < 0.0f) || (move_dir == ImGuiDir_Right && dax > 0.0f) || (move_dir == ImGuiDir_Up && day < 0.0f) || (move_dir == ImGuiDir_Down && day > 0.0f))
            {
                result->DistAxial = dist_axial;
                new_best = true;
            }

    return new_best;
}